

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<std::__cxx11::string>
          (Attribute *this,double t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 local_60 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  TimeSampleInterpolationType tinterp_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&v.contained + 0x18),t);
    bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&v.contained + 0x18));
    if ((bVar1) && (bVar1 = has_value(this), bVar1)) {
      primvar::PrimVar::get_value<std::__cxx11::string>(&local_88,&this->_var);
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,&local_88);
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_88);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_60);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_60);
        std::__cxx11::string::operator=((string *)dst,(string *)pvVar2);
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60);
      if (bVar1) goto LAB_002ccfa8;
    }
    bVar1 = has_timesamples(this);
    if (bVar1) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<std::__cxx11::string>(&this->_var,t,tinterp,dst)
      ;
    }
    else {
      this_local._7_1_ = get_value<std::__cxx11::string>(this,dst);
    }
  }
LAB_002ccfa8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }